

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::createPrimRefArray_presplit<embree::TriangleMesh,embree::avx::TriangleSplitterFactory>
          (PrimInfo *__return_storage_ptr__,avx *this,Geometry *geometry,uint geomID,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  unsigned_long uVar4;
  runtime_error *prVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  size_t *psVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  size_t taskCount;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  auto_partitioner local_2939;
  unsigned_long local_2938;
  ulong local_2930;
  unsigned_long local_2928;
  uint local_291c;
  Geometry *local_2918;
  mvector<PrimRef> *local_2910;
  long local_2908;
  anon_class_8_1_898bcfc2_conflict4 local_2900;
  anon_class_24_3_3a534e91 local_28f8;
  anon_class_40_5_11684cf9 local_28e0;
  task_group_context local_28b8;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> local_2838;
  
  local_2908 = CONCAT44(in_register_0000000c,geomID);
  local_291c = (uint)geometry;
  local_2918 = (Geometry *)this;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
  local_2930 = (ulong)local_2918->numPrimitives;
  local_2928 = 0;
  local_2910 = (mvector<PrimRef> *)numPrimRefs;
  local_28f8.geometry = &local_2918;
  local_28f8.prims = (mvector<PrimRef> *)numPrimRefs;
  local_28f8.geomID = &local_291c;
  iVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar6 = (local_2930 - local_2928) + 0x3ff >> 10;
  if ((ulong)(long)iVar3 < uVar6) {
    uVar6 = (long)iVar3;
  }
  uVar4 = 0x40;
  if (uVar6 < 0x40) {
    uVar4 = uVar6;
  }
  local_28e0.taskCount = &local_2938;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2938 = uVar4;
  local_28e0.first = &local_2928;
  local_28e0.last = &local_2930;
  local_28e0.state = &local_2838;
  local_28e0.func = &local_28f8;
  tbb::detail::r1::initialize(&local_28b8);
  local_2900.func = &local_28e0;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar4,1,&local_2900,&local_2939,&local_28b8);
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  if (cVar2 != '\0') {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"task cancelled");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  aVar8.m128[2] = INFINITY;
  aVar8._0_8_ = 0x7f8000007f800000;
  aVar8.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar8;
  aVar10.m128[2] = -INFINITY;
  aVar10._0_8_ = 0xff800000ff800000;
  aVar10.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar10;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar8;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar10;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  aVar12 = aVar8;
  aVar13 = aVar10;
  if (local_2938 != 0) {
    auVar9._0_8_ = __return_storage_ptr__->begin;
    auVar9._8_8_ = __return_storage_ptr__->end;
    psVar7 = &local_2838.sums[0].begin;
    uVar4 = local_2938;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -8) = aVar8;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -6) = aVar10;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -4) = aVar12;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -2) = aVar13;
      sVar1 = __return_storage_ptr__->end;
      *psVar7 = __return_storage_ptr__->begin;
      psVar7[1] = sVar1;
      aVar8.m128 = (__m128)vminps_avx(aVar8.m128,*(undefined1 (*) [16])(psVar7 + -0x288));
      aVar10.m128 = (__m128)vmaxps_avx(aVar10.m128,*(undefined1 (*) [16])(psVar7 + -0x286));
      aVar12.m128 = (__m128)vminps_avx(aVar12.m128,*(undefined1 (*) [16])(psVar7 + -0x284));
      aVar13.m128 = (__m128)vmaxps_avx(aVar13.m128,*(undefined1 (*) [16])(psVar7 + -0x282));
      auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(psVar7 + -0x280));
      __return_storage_ptr__->begin = auVar9._0_8_;
      __return_storage_ptr__->end = auVar9._8_8_;
      psVar7 = psVar7 + 10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar8;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar10;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar12;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar13;
  if (__return_storage_ptr__->end - __return_storage_ptr__->begin != local_2908) {
    (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
    local_2930 = (ulong)local_2918->numPrimitives;
    local_28f8.geometry = &local_2918;
    local_28f8.prims = local_2910;
    local_28f8.geomID = &local_291c;
    local_2928 = 0;
    iVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar6 = (local_2930 - local_2928) + 0x3ff >> 10;
    if ((ulong)(long)iVar3 < uVar6) {
      uVar6 = (long)iVar3;
    }
    uVar4 = 0x40;
    if (uVar6 < 0x40) {
      uVar4 = uVar6;
    }
    local_28e0.first = &local_2928;
    local_28e0.last = &local_2930;
    local_28e0.taskCount = &local_2938;
    local_28e0.func = &local_28f8;
    local_28b8.my_version = proxy_support;
    local_28b8.my_traits = (context_traits)0x4;
    local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_28b8.my_name = CUSTOM_CTX;
    local_2938 = uVar4;
    local_28e0.state = &local_2838;
    tbb::detail::r1::initialize(&local_28b8);
    local_2900.func = &local_28e0;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar4,1,&local_2900,&local_2939,&local_28b8);
    cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
    if (cVar2 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_28b8);
    auVar9 = ZEXT816(0) << 0x40;
    if (local_2938 == 0) {
      aVar13.m128[2] = -INFINITY;
      aVar13._0_8_ = 0xff800000ff800000;
      aVar13.m128[3] = -INFINITY;
      aVar14.m128[2] = INFINITY;
      aVar14._0_8_ = 0x7f8000007f800000;
      aVar14.m128[3] = INFINITY;
      aVar11 = aVar14;
      aVar12 = aVar13;
    }
    else {
      aVar11.m128[2] = INFINITY;
      aVar11._0_8_ = 0x7f8000007f800000;
      aVar11.m128[3] = INFINITY;
      aVar12.m128[2] = -INFINITY;
      aVar12._0_8_ = 0xff800000ff800000;
      aVar12.m128[3] = -INFINITY;
      psVar7 = &local_2838.sums[0].begin;
      aVar13 = aVar12;
      aVar14 = aVar11;
      do {
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -8) = aVar14;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -6) = aVar13;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -4) = aVar11;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -2) = aVar12;
        *(undefined1 (*) [16])psVar7 = auVar9;
        aVar14.m128 = (__m128)vminps_avx(aVar14.m128,*(undefined1 (*) [16])(psVar7 + -0x288));
        aVar13.m128 = (__m128)vmaxps_avx(aVar13.m128,*(undefined1 (*) [16])(psVar7 + -0x286));
        aVar11.m128 = (__m128)vminps_avx(aVar11.m128,*(undefined1 (*) [16])(psVar7 + -0x284));
        aVar12.m128 = (__m128)vmaxps_avx(aVar12.m128,*(undefined1 (*) [16])(psVar7 + -0x282));
        auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(psVar7 + -0x280));
        psVar7 = psVar7 + 10;
        local_2938 = local_2938 - 1;
      } while (local_2938 != 0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar14;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar13;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar11;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar12;
    __return_storage_ptr__->begin = auVar9._0_8_;
    __return_storage_ptr__->end = auVar9._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Geometry* geometry, unsigned int geomID, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelPrefixSumState<PrimInfo> pstate;
      
      /* first try */
      progressMonitor(0);
      PrimInfo pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	  return geometry->createPrimRefArray(prims,r,r.begin(),geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	      return geometry->createPrimRefArray(prims,r,base.size(),geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}
      return pinfo;	
    }